

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O2

SpeakerPosition * __thiscall
ear::GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock
          (SpeakerPosition *__return_storage_ptr__,GainCalculatorDirectSpeakersImpl *this,
          SpeakerPosition *position)

{
  uint uVar1;
  CartesianSpeakerPosition CStack_1a8;
  CartesianSpeakerPosition local_e0;
  
  uVar1 = position->which_ >> 0x1f ^ position->which_;
  if (uVar1 < 0x14) {
    switch(uVar1) {
    case 0:
      PolarSpeakerPosition::PolarSpeakerPosition
                ((PolarSpeakerPosition *)&CStack_1a8,(PolarSpeakerPosition *)&position->storage_);
      _applyScreenEdgeLock
                ((PolarSpeakerPosition *)&local_e0,this,(PolarSpeakerPosition *)&CStack_1a8);
      PolarSpeakerPosition::PolarSpeakerPosition
                ((PolarSpeakerPosition *)&__return_storage_ptr__->storage_,
                 (PolarSpeakerPosition *)&local_e0);
      __return_storage_ptr__->which_ = 0;
      break;
    case 1:
      CartesianSpeakerPosition::CartesianSpeakerPosition
                (&CStack_1a8,(CartesianSpeakerPosition *)&position->storage_);
      _applyScreenEdgeLock(&local_e0,this,&CStack_1a8);
      CartesianSpeakerPosition::CartesianSpeakerPosition
                ((CartesianSpeakerPosition *)&__return_storage_ptr__->storage_,&local_e0);
      __return_storage_ptr__->which_ = 1;
      break;
    default:
      goto switchD_001591c6_caseD_2;
    }
    ScreenEdgeLock::~ScreenEdgeLock(&local_e0.screenEdgeLock);
    ScreenEdgeLock::~ScreenEdgeLock(&CStack_1a8.screenEdgeLock);
    return __return_storage_ptr__;
  }
switchD_001591c6_caseD_2:
  boost::detail::variant::
  forced_return<boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>>();
}

Assistant:

SpeakerPosition GainCalculatorDirectSpeakersImpl::_applyScreenEdgeLock(
      const SpeakerPosition& position) {
    return boost::apply_visitor(
        [this](const auto& p) {
          return SpeakerPosition(_applyScreenEdgeLock(p));
        },
        position);
  }